

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  ImVector<ImDrawChannel> *this_00;
  ImDrawChannel *pIVar1;
  int i;
  int i_00;
  
  this_00 = &this->_Channels;
  for (i_00 = 0; i_00 < this_00->Size; i_00 = i_00 + 1) {
    if (i_00 == this->_Current) {
      pIVar1 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
      (pIVar1->_CmdBuffer).Size = L'\0';
      (pIVar1->_CmdBuffer).Capacity = L'\0';
      (pIVar1->_CmdBuffer).Data = (ImDrawCmd *)0x0;
      (pIVar1->_IdxBuffer).Size = L'\0';
      (pIVar1->_IdxBuffer).Capacity = L'\0';
      (pIVar1->_IdxBuffer).Data = (ImDrawIdx *)0x0;
    }
    pIVar1 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
    ImVector<ImDrawCmd>::clear((ImVector<ImDrawCmd> *)pIVar1);
    pIVar1 = ImVector<ImDrawChannel>::operator[](this_00,i_00);
    ImVector<unsigned_short>::clear((ImVector<unsigned_short> *)&pIVar1->_IdxBuffer);
  }
  this->_Current = 0;
  this->_Count = 1;
  ImVector<ImDrawChannel>::clear(this_00);
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}